

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JsonReporter::listTags
          (JsonReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags)

{
  bool bVar1;
  JsonValueWriter *this_00;
  reference pSVar2;
  undefined8 in_RSI;
  JsonValueWriter *in_RDI;
  StringRef SVar3;
  StringRef alias;
  iterator __end3;
  iterator __begin3;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range3;
  JsonArrayWriter aliases_writer;
  JsonObjectWriter tag_writer;
  TagInfo *tag;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *__range1;
  JsonArrayWriter writer;
  JsonObjectWriter *this_01;
  JsonReporter *in_stack_fffffffffffffa50;
  size_t local_5a8;
  JsonObjectWriter local_5a0 [17];
  char *local_408;
  size_type sStack_400;
  _Self local_3f0;
  _Self local_3e8;
  reference local_3e0;
  StringRef local_3d8;
  JsonObjectWriter local_3c8 [18];
  undefined1 local_218 [24];
  reference local_200;
  TagInfo *local_1f8;
  __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
  local_1f0;
  undefined8 local_1e8;
  StringRef local_1d0;
  JsonObjectWriter local_1c0 [18];
  undefined8 local_10;
  
  local_10 = in_RSI;
  startListing(in_stack_fffffffffffffa50);
  this_00 = (JsonValueWriter *)
            std::
            stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
            ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                   *)0x1a5c68);
  local_1d0 = operator____sr((char *)this_00,(size_t)in_RDI);
  this_01 = local_1c0;
  JsonObjectWriter::write(this_01,(int)this_00,local_1d0.m_start,local_1d0.m_size);
  JsonValueWriter::writeArray(in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5cd6);
  local_1e8 = local_10;
  local_1f0._M_current =
       (TagInfo *)
       std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::begin
                 ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)in_RDI);
  local_1f8 = (TagInfo *)
              std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::end
                        ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                        *)this_00,
                       (__normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    local_200 = __gnu_cxx::
                __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                ::operator*(&local_1f0);
    JsonArrayWriter::writeObject((JsonArrayWriter *)this_01);
    local_3d8 = operator____sr((char *)this_00,(size_t)in_RDI);
    JsonObjectWriter::write(local_3c8,(int)local_218,local_3d8.m_start,local_3d8.m_size);
    JsonValueWriter::writeArray(in_RDI);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5dc6);
    local_3e0 = local_200;
    local_3e8._M_node =
         (_Base_ptr)
         std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
         ::begin((set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                  *)in_RDI);
    local_3f0._M_node =
         (_Base_ptr)
         std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
         ::end((set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                *)in_RDI);
    while( true ) {
      bVar1 = std::operator!=(&local_3e8,&local_3f0);
      if (!bVar1) break;
      pSVar2 = std::_Rb_tree_const_iterator<Catch::StringRef>::operator*
                         ((_Rb_tree_const_iterator<Catch::StringRef> *)0x1a5e2b);
      local_408 = pSVar2->m_start;
      sStack_400 = pSVar2->m_size;
      JsonArrayWriter::write<Catch::StringRef>((JsonArrayWriter *)this_00,(StringRef *)in_RDI);
      std::_Rb_tree_const_iterator<Catch::StringRef>::operator++
                ((_Rb_tree_const_iterator<Catch::StringRef> *)this_00);
    }
    JsonArrayWriter::~JsonArrayWriter((JsonArrayWriter *)this_00);
    SVar3 = operator____sr((char *)this_00,(size_t)in_RDI);
    local_5a8 = SVar3.m_size;
    JsonObjectWriter::write(local_5a0,(int)local_218,SVar3.m_start,local_5a8);
    JsonValueWriter::write<unsigned_long>(this_00,(unsigned_long *)in_RDI);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5f6a);
    JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_00);
    __gnu_cxx::
    __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
    ::operator++(&local_1f0);
  }
  JsonArrayWriter::~JsonArrayWriter((JsonArrayWriter *)this_00);
  return;
}

Assistant:

void JsonReporter::listTags( std::vector<TagInfo> const& tags ) {
        startListing();

        auto writer = m_objectWriters.top().write( "tags"_sr ).writeArray();
        for ( auto const& tag : tags ) {
            auto tag_writer = writer.writeObject();
            {
                auto aliases_writer =
                    tag_writer.write( "aliases"_sr ).writeArray();
                for ( auto alias : tag.spellings ) {
                    aliases_writer.write( alias );
                }
            }
            tag_writer.write( "count"_sr ).write( tag.count );
        }
    }